

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O1

void __thiscall Mems::compare_by_x_m(Mems *this)

{
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> __first;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> __last;
  long lVar1;
  ulong uVar2;
  
  __first._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar2 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b347);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first,__last,(_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b347);
    return;
  }
  return;
}

Assistant:

void Mems::compare_by_x_m(){
  std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_x);
}